

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
libcellml::Units::addUnit(Units *this,StandardUnit standardUnit,double exponent,string *id)

{
  mapped_type *reference;
  allocator<char> local_51;
  double local_50;
  StandardUnit local_44;
  string local_40;
  
  local_50 = exponent;
  local_44 = standardUnit;
  reference = std::
              map<libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Units::StandardUnit>,_std::allocator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at((map<libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Units::StandardUnit>,_std::allocator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)standardUnitToString_abi_cxx11_,&local_44);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"0",&local_51);
  addUnit(this,reference,&local_40,local_50,1.0,id);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Units::addUnit(StandardUnit standardUnit, double exponent, const std::string &id)
{
    addUnit(standardUnitToString.at(standardUnit), "0", exponent, 1.0, id);
}